

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmLib.c
# Opt level: O2

void Sfm_LibPrepareAdd(Sfm_Lib_t *p,word *pTruth,int *Perm,int nFanins,Mio_Cell2_t *pCellBot,
                      Mio_Cell2_t *pCellTop,int InTop)

{
  Vec_Int_t *p_00;
  Vec_Int_t *p_01;
  int *piVar1;
  int *piVar2;
  uint uVar3;
  word wVar4;
  int i;
  int iVar5;
  int iVar6;
  int i_00;
  int *piVar7;
  ulong uVar8;
  int Addition;
  int iVar9;
  char cVar10;
  ulong uVar11;
  int iVar12;
  Sfm_Fun_t *pSVar13;
  int Profile [8];
  int InvPerm [8];
  
  if (pCellTop == (Mio_Cell2_t *)0x0) {
    iVar12 = 0;
  }
  else {
    iVar12 = (int)pCellTop->Area;
  }
  wVar4 = pCellBot->Area;
  i = Vec_MemHashInsert(p->vTtMem,pTruth);
  p_00 = &p->vLists;
  if (i == (p->vLists).nSize) {
    Vec_IntPush(p_00,-1);
    Vec_IntPush(&p->vCounts,0);
    Vec_IntPush(&p->vHits,0);
  }
  iVar12 = iVar12 + (int)wVar4;
  if (p->fDelay == 0) {
    iVar5 = Vec_IntEntry(p_00,i);
    if (iVar5 == -1) {
      pSVar13 = (Sfm_Fun_t *)0x0;
    }
    else {
      pSVar13 = p->pObjs + iVar5;
    }
    while (pSVar13 != (Sfm_Fun_t *)0x0) {
      if (pSVar13->Area <= iVar12) {
        return;
      }
      piVar7 = &pSVar13->Next;
      pSVar13 = (Sfm_Fun_t *)0x0;
      if ((long)*piVar7 != -1) {
        pSVar13 = p->pObjs + *piVar7;
      }
    }
    uVar3 = 0;
    if (0 < nFanins) {
      uVar3 = nFanins;
    }
    uVar11 = (ulong)uVar3;
  }
  else {
    if ((p->vProfs).nSize != p->nObjs) {
      __assert_fail("Vec_IntSize(&p->vProfs) == p->nObjs",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/sfm/sfmLib.c"
                    ,0x152,
                    "void Sfm_LibPrepareAdd(Sfm_Lib_t *, word *, int *, int, Mio_Cell2_t *, Mio_Cell2_t *, int)"
                   );
    }
    Sfm_LibCellProfile(pCellBot,pCellTop,InTop,nFanins,Perm,Profile);
    (p->vTemp).nSize = 0;
    iVar5 = Vec_IntEntry(p_00,i);
    if (iVar5 == -1) {
      pSVar13 = (Sfm_Fun_t *)0x0;
    }
    else {
      pSVar13 = p->pObjs + iVar5;
    }
    p_01 = &p->vTemp;
    uVar3 = 0;
    if (0 < nFanins) {
      uVar3 = nFanins;
    }
    uVar11 = (ulong)uVar3;
    while (pSVar13 != (Sfm_Fun_t *)0x0) {
      Vec_IntPush(p_01,(int)(((long)pSVar13 - (long)p->pObjs) / 0x1c));
      iVar5 = Vec_IntEntry(&p->vProfs,(int)(((long)pSVar13 - (long)p->pObjs) / 0x1c));
      piVar7 = Vec_IntEntryP(&p->vStore,iVar5);
      if (pSVar13->Area <= iVar12) {
        uVar8 = 0;
        do {
          if (uVar11 == uVar8) {
            p->nObjSkipped = p->nObjSkipped + 1;
            return;
          }
          piVar2 = Profile + uVar8;
          piVar1 = piVar7 + uVar8;
          uVar8 = uVar8 + 1;
        } while (*piVar1 <= *piVar2);
      }
      piVar7 = &pSVar13->Next;
      pSVar13 = (Sfm_Fun_t *)0x0;
      if ((long)*piVar7 != -1) {
        pSVar13 = p->pObjs + *piVar7;
      }
    }
    iVar5 = 0;
    for (iVar9 = 0; iVar6 = (p->vTemp).nSize, iVar9 < iVar6; iVar9 = iVar9 + 1) {
      iVar6 = Vec_IntEntry(p_01,iVar9);
      i_00 = Vec_IntEntry(&p->vProfs,iVar6);
      piVar7 = Vec_IntEntryP(&p->vStore,i_00);
      if (iVar12 <= p->pObjs[iVar6].Area) {
        uVar8 = 0;
        do {
          if (uVar11 == uVar8) {
            p->nObjRemoved = p->nObjRemoved + 1;
            goto LAB_00408bca;
          }
          piVar2 = Profile + uVar8;
          piVar1 = piVar7 + uVar8;
          uVar8 = uVar8 + 1;
        } while (*piVar2 <= *piVar1);
      }
      Vec_IntWriteEntry(p_01,iVar5,iVar6);
      iVar5 = iVar5 + 1;
LAB_00408bca:
    }
    if (iVar5 < iVar9) {
      if (iVar5 == 0) {
        Vec_IntWriteEntry(p_00,i,-1);
      }
      else {
        if (iVar6 < iVar5) {
          __assert_fail("p->nSize >= nSizeNew",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                        ,0x2ac,"void Vec_IntShrink(Vec_Int_t *, int)");
        }
        (p->vTemp).nSize = iVar5;
        iVar9 = Vec_IntEntry(p_01,0);
        Vec_IntWriteEntry(p_00,i,iVar9);
        for (iVar5 = 1; iVar5 < (p->vTemp).nSize; iVar5 = iVar5 + 1) {
          iVar6 = Vec_IntEntry(p_01,iVar5);
          p->pObjs[iVar9].Next = iVar6;
          iVar9 = iVar6;
        }
        p->pObjs[iVar9].Next = -1;
      }
    }
  }
  for (uVar8 = 0; uVar11 != uVar8; uVar8 = uVar8 + 1) {
    InvPerm[Perm[uVar8]] = (int)uVar8;
  }
  if (p->fDelay != 0) {
    Vec_IntPush(&p->vProfs,(p->vStore).nSize);
    for (uVar8 = 0; uVar11 != uVar8; uVar8 = uVar8 + 1) {
      Vec_IntPush(&p->vStore,Profile[uVar8]);
    }
  }
  iVar5 = p->nObjs;
  if (iVar5 == p->nObjsAlloc) {
    iVar9 = iVar5 * 2;
    if (p->pObjs == (Sfm_Fun_t *)0x0) {
      pSVar13 = (Sfm_Fun_t *)malloc((long)iVar5 * 0x38);
      iVar6 = iVar5;
    }
    else {
      pSVar13 = (Sfm_Fun_t *)realloc(p->pObjs,(long)iVar5 * 0x38);
      iVar5 = p->nObjs;
      iVar6 = p->nObjsAlloc;
    }
    p->pObjs = pSVar13;
    memset(pSVar13 + iVar6,0,(long)iVar6 * 0x1c);
    p->nObjsAlloc = iVar9;
  }
  else {
    pSVar13 = p->pObjs;
  }
  pSVar13[iVar5].Area = iVar12;
  iVar12 = Vec_IntEntry(p_00,i);
  pSVar13[iVar5].Next = iVar12;
  iVar12 = p->nObjs;
  p->nObjs = iVar12 + 1;
  Vec_IntWriteEntry(p_00,i,iVar12);
  Vec_IntAddToEntry(&p->vCounts,i,Addition);
  if ((*(uint *)&pCellBot->field_0x10 & 0x3ffff80) != 0) {
    __assert_fail("pCellBot->Id < 128",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/sfm/sfmLib.c"
                  ,0x19d,
                  "void Sfm_LibPrepareAdd(Sfm_Lib_t *, word *, int *, int, Mio_Cell2_t *, Mio_Cell2_t *, int)"
                 );
  }
  pSVar13[iVar5].pFansB[0] = (char)*(uint *)&pCellBot->field_0x10;
  for (uVar11 = 0; uVar11 < *(uint *)&pCellBot->field_0x10 >> 0x1c; uVar11 = uVar11 + 1) {
    pSVar13[iVar5].pFansB[uVar11 + 1] = (char)InvPerm[uVar11];
  }
  if (pCellTop != (Mio_Cell2_t *)0x0) {
    if ((*(uint *)&pCellTop->field_0x10 & 0x3ffff80) != 0) {
      __assert_fail("pCellTop->Id < 128",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/sfm/sfmLib.c"
                    ,0x1a3,
                    "void Sfm_LibPrepareAdd(Sfm_Lib_t *, word *, int *, int, Mio_Cell2_t *, Mio_Cell2_t *, int)"
                   );
    }
    pSVar13[iVar5].pFansT[0] = (char)*(uint *)&pCellTop->field_0x10;
    for (uVar8 = 0; iVar12 = (int)uVar11, uVar8 < *(uint *)&pCellTop->field_0x10 >> 0x1c;
        uVar8 = uVar8 + 1) {
      cVar10 = '\x10';
      if ((uint)InTop != uVar8) {
        uVar11 = (ulong)(iVar12 + 1);
        cVar10 = (char)InvPerm[iVar12];
      }
      pSVar13[iVar5].pFansT[uVar8 + 1] = cVar10;
    }
    if (iVar12 != nFanins) {
      __assert_fail("k == nFanins",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/sfm/sfmLib.c"
                    ,0x1a7,
                    "void Sfm_LibPrepareAdd(Sfm_Lib_t *, word *, int *, int, Mio_Cell2_t *, Mio_Cell2_t *, int)"
                   );
    }
  }
  return;
}

Assistant:

void Sfm_LibPrepareAdd( Sfm_Lib_t * p, word * pTruth, int * Perm, int nFanins, Mio_Cell2_t * pCellBot, Mio_Cell2_t * pCellTop, int InTop )
{
    Sfm_Fun_t * pObj;
    int InvPerm[SFM_SUPP_MAX], Profile[SFM_SUPP_MAX];
    int Area = (int)pCellBot->Area + (pCellTop ? (int)pCellTop->Area : 0);
    int i, k, Id, Prev, Offset, * pProf, iFunc = Vec_MemHashInsert( p->vTtMem, pTruth );
    if ( iFunc == Vec_IntSize(&p->vLists) )
    {
        Vec_IntPush( &p->vLists, -1 );
        Vec_IntPush( &p->vCounts, 0 );
        Vec_IntPush( &p->vHits,   0 );
    }
    assert( pCellBot != NULL );
    // iterate through the supergates of this truth table
    if ( p->fDelay )
    {
        assert( Vec_IntSize(&p->vProfs) == p->nObjs );
        Sfm_LibCellProfile( pCellBot, pCellTop, InTop, nFanins, Perm, Profile );
        // check if new one is contained in old ones
        Vec_IntClear( &p->vTemp );
        Sfm_LibForEachSuper( p, pObj, iFunc )
        {
            Vec_IntPush( &p->vTemp, Sfm_LibFunId(p, pObj) );
            Offset = Vec_IntEntry( &p->vProfs, Sfm_LibFunId(p, pObj) );
            pProf  = Vec_IntEntryP( &p->vStore, Offset );
            if ( Sfm_LibNewIsContained(pObj, pProf, Area, Profile, nFanins) )
            {
                p->nObjSkipped++;
                return;
            }
        }
        // check if old ones are contained in new one
        k = 0;
        Vec_IntForEachEntry( &p->vTemp, Id, i )
        {
            Offset = Vec_IntEntry( &p->vProfs, Id );
            pProf  = Vec_IntEntryP( &p->vStore, Offset );
            if ( !Sfm_LibNewContains(Sfm_LibFun(p, Id), pProf, Area, Profile, nFanins) )
                Vec_IntWriteEntry( &p->vTemp, k++, Id );
            else
                p->nObjRemoved++;
        }
        if ( k < i ) // change
        {
            if ( k == 0 )
                Vec_IntWriteEntry( &p->vLists, iFunc, -1 );
            else
            {
                Vec_IntShrink( &p->vTemp, k );
                Prev = Vec_IntEntry(&p->vTemp, 0);
                Vec_IntWriteEntry( &p->vLists, iFunc, Prev );
                Vec_IntForEachEntryStart( &p->vTemp, Id, i, 1 )
                {
                    Sfm_LibFun(p, Prev)->Next = Id;
                    Prev = Id;
                }
                Sfm_LibFun(p, Prev)->Next = -1;
            }
        }
    }
    else
    {
        Sfm_LibForEachSuper( p, pObj, iFunc )
        {
            if ( Area >= pObj->Area )
                return;
        }
    }
    for ( k = 0; k < nFanins; k++ )
        InvPerm[Perm[k]] = k;
    // create delay profile
    if ( p->fDelay )
    {
        Vec_IntPush( &p->vProfs, Vec_IntSize(&p->vStore) );
        for ( k = 0; k < nFanins; k++ )
            Vec_IntPush( &p->vStore, Profile[k] );
    }
    // create new object
    if ( p->nObjs == p->nObjsAlloc )
    {
        int nObjsAlloc = 2 * p->nObjsAlloc;
        p->pObjs = ABC_REALLOC( Sfm_Fun_t, p->pObjs, nObjsAlloc );
        memset( p->pObjs + p->nObjsAlloc, 0, sizeof(Sfm_Fun_t) * p->nObjsAlloc );
        p->nObjsAlloc = nObjsAlloc;
    }
    pObj = p->pObjs + p->nObjs;
    pObj->Area = Area;
    pObj->Next = Vec_IntEntry(&p->vLists, iFunc);
    Vec_IntWriteEntry( &p->vLists, iFunc, p->nObjs++ );
    Vec_IntAddToEntry( &p->vCounts, iFunc, 1 );
    // create gate
    assert( pCellBot->Id < 128 );
    pObj->pFansB[0] = (char)pCellBot->Id;
    for ( k = 0; k < (int)pCellBot->nFanins; k++ )
        pObj->pFansB[k+1] = InvPerm[k];
    if ( pCellTop == NULL )
        return;
    assert( pCellTop->Id < 128 );
    pObj->pFansT[0] = (char)pCellTop->Id;
    for ( i = 0; i < (int)pCellTop->nFanins; i++ )
        pObj->pFansT[i+1] = (char)(i == InTop ? 16 : InvPerm[k++]);
    assert( k == nFanins );
}